

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t uncompress_file(archive_read *a)

{
  wchar_t *pwVar1;
  file_header *pfVar2;
  int64_t *piVar3;
  compressed_block_header cVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint16_t uVar8;
  size_t __size;
  archive_read *paVar9;
  uint uVar10;
  wchar_t wVar11;
  uint32_t uVar12;
  int iVar13;
  wchar_t wVar14;
  long lVar15;
  uint8_t *puVar16;
  decode_table *pdVar17;
  void *pvVar18;
  size_t sVar19;
  uint *puVar20;
  int64_t iVar21;
  long lVar22;
  byte bVar23;
  sbyte sVar24;
  ushort uVar25;
  uint32_t uVar26;
  decode_table *pdVar27;
  rar5 *prVar28;
  uint8_t uVar29;
  char *pcVar30;
  uint uVar31;
  decode_table *pdVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  wchar_t wVar37;
  rar5 *prVar38;
  rar5 *prVar39;
  ulong uVar40;
  size_t sVar41;
  rar5 *prVar42;
  bool bVar43;
  uint16_t num_1;
  uint16_t filter_type;
  uint16_t num;
  uint8_t bit_length [20];
  uint8_t table [430];
  ushort local_27c;
  ushort local_27a;
  archive_read *local_278;
  decode_table *local_270;
  rar5 *local_268;
  rar5 *local_260;
  ulong local_258;
  uint *local_250;
  wchar_t local_244;
  rar5 *local_240;
  decode_table *local_238;
  ulong local_230;
  wchar_t local_224;
  ulong local_220;
  uint local_218 [8];
  decode_table *local_1f8;
  decode_table *local_1f0;
  ulong local_1e8 [38];
  uint8_t local_b6 [64];
  uint8_t local_76 [16];
  uint8_t local_66 [54];
  
  local_278 = a;
  do {
    prVar39 = (rar5 *)a->format->data;
    if ((undefined1  [19312])((undefined1  [19312])prVar39->cstate & (undefined1  [19312])0x1) ==
        (undefined1  [19312])0x0) {
      if ((((ulong)prVar39->main & 1) == 0) || ((prVar39->cstate).window_buf == (uint8_t *)0x0)) {
        (prVar39->file).calculated_crc32 = 0;
        lVar22 = (prVar39->cstate).window_size;
        lVar15 = lVar22 + -1;
        if (lVar22 == 0) {
          lVar15 = 0;
        }
        (prVar39->cstate).window_mask = lVar15;
        free((prVar39->cstate).window_buf);
        free((prVar39->cstate).filtered_buf);
        __size = (prVar39->cstate).window_size;
        if ((long)__size < 1) {
          (prVar39->cstate).window_buf = (uint8_t *)0x0;
          puVar16 = (uint8_t *)0x0;
        }
        else {
          puVar16 = (uint8_t *)calloc(1,__size);
          (prVar39->cstate).window_buf = puVar16;
          puVar16 = (uint8_t *)calloc(1,__size);
        }
        (prVar39->cstate).filtered_buf = puVar16;
        *(undefined8 *)(prVar39->cstate).dready = 0;
        (prVar39->cstate).dready[0].buf = (uint8_t *)0x0;
        (prVar39->cstate).dready[0].size = 0;
        (prVar39->cstate).dready[0].offset = 0;
        *(undefined8 *)((prVar39->cstate).dready + 1) = 0;
        (prVar39->cstate).dready[1].buf = (uint8_t *)0x0;
        (prVar39->cstate).dready[1].size = 0;
        (prVar39->cstate).dready[1].offset = 0;
        (prVar39->cstate).write_ptr = 0;
        (prVar39->cstate).last_write_ptr = 0;
        memset(&(prVar39->cstate).bd,0,0x4a9c);
      }
      *(byte *)&prVar39->cstate = *(byte *)&prVar39->cstate | 1;
    }
    if ((prVar39->cstate).window_size == 0) {
      archive_set_error(&a->archive,0x54,"Invalid window size declaration in this file");
LAB_0013431a:
      wVar14 = L'\xffffffe2';
    }
    else {
      prVar42 = prVar39;
      if ((undefined1  [19312])((undefined1  [19312])prVar39->cstate & (undefined1  [19312])0x2) ==
          (undefined1  [19312])0x0) {
LAB_0013425d:
        prVar42 = (rar5 *)a->format->data;
        bVar23 = *(byte *)&prVar42->cstate;
        *(byte *)&prVar42->cstate = bVar23 & 0xfd;
        if ((prVar42->cstate).filters.size == 0) {
LAB_001342b6:
          *(byte *)&prVar42->cstate = bVar23 | 2;
          iVar13 = 0;
        }
        else {
          puVar20 = (uint *)(prVar42->cstate).filters.arr[(prVar42->cstate).filters.beg_pos];
          lVar22 = (prVar42->cstate).write_ptr;
          lVar15 = *(long *)(puVar20 + 4);
          if ((lVar22 <= lVar15) || (lVar22 < *(long *)(puVar20 + 6) + lVar15)) goto LAB_001342b6;
          lVar22 = (prVar42->cstate).last_write_ptr;
          if (lVar22 == lVar15) {
            prVar38 = (rar5 *)a->format->data;
            (prVar38->cstate).dready[1].size = 0;
            (prVar38->cstate).dready[1].offset = 0;
            *(undefined8 *)((prVar38->cstate).dready + 1) = 0;
            (prVar38->cstate).dready[1].buf = (uint8_t *)0x0;
            (prVar38->cstate).dready[0].size = 0;
            (prVar38->cstate).dready[0].offset = 0;
            *(undefined8 *)(prVar38->cstate).dready = 0;
            (prVar38->cstate).dready[0].buf = (uint8_t *)0x0;
            local_260 = prVar39;
            free((prVar38->cstate).filtered_buf);
            local_240 = *(rar5 **)(puVar20 + 6);
            puVar16 = (uint8_t *)malloc((size_t)local_240);
            prVar39 = local_240;
            (prVar38->cstate).filtered_buf = puVar16;
            if (puVar16 == (uint8_t *)0x0) {
              archive_set_error(&a->archive,0xc,"Can\'t allocate memory for filter data.");
LAB_00135733:
              bVar43 = false;
              iVar13 = -0x1e;
            }
            else {
              uVar36 = *puVar20;
              if (uVar36 - 1 < 2) {
                pdVar17 = (decode_table *)(prVar38->cstate).window_buf;
                uVar40 = (prVar38->cstate).window_mask;
                uVar34 = *(long *)(puVar20 + 4) + (prVar38->cstate).solid_offset;
                uVar35 = uVar34 & uVar40;
                prVar28 = (rar5 *)((long)&local_240->header_initialized + uVar34 & uVar40);
                local_270 = (decode_table *)(ulong)uVar36;
                if ((long)prVar28 < (long)uVar35) {
                  local_268 = prVar28;
                  local_238 = pdVar17;
                  memcpy(puVar16,(void *)((long)pdVar17->decode_len + (uVar35 - 4)),
                         (uVar40 - uVar35) + 1);
                  puVar16 = puVar16 + (uVar40 - uVar35) + 1;
                  prVar28 = local_268;
                  pdVar17 = local_238;
                }
                else {
                  pdVar17 = (decode_table *)((long)pdVar17->decode_len + (uVar35 - 4));
                  prVar28 = local_240;
                }
                memcpy(puVar16,pdVar17,(size_t)prVar28);
                a = local_278;
                if (4 < (long)prVar39) {
                  pdVar17 = local_270;
                  uVar40 = 0;
                  do {
                    lVar22 = (prVar38->cstate).solid_offset + *(long *)(puVar20 + 4);
                    uVar34 = uVar40 + 1;
                    uVar35 = (prVar38->cstate).window_mask;
                    uVar29 = (prVar38->cstate).window_buf[lVar22 + uVar40 & uVar35];
                    if ((uVar29 == 0xe8) || ((int)pdVar17 == 2 && uVar29 == 0xe9)) {
                      lVar15 = *(long *)(puVar20 + 4) + uVar34;
                      uVar36 = (uint)lVar15;
                      uVar31 = uVar36 + 0xffffff;
                      if (-1 < lVar15) {
                        uVar31 = uVar36;
                      }
                      iVar13 = uVar36 - (uVar31 & 0xff000000);
                      uVar12 = read_filter_data(prVar38,(uint)uVar35 & (int)lVar22 + (int)uVar34);
                      if ((int)uVar12 < 0) {
                        if (-1 < (int)(iVar13 + uVar12)) {
                          uVar26 = uVar12 + 0x1000000;
                          goto LAB_001356dd;
                        }
                      }
                      else if ((int)uVar12 < 0x1000000) {
                        uVar12 = uVar12 - iVar13;
                        uVar26 = uVar12;
LAB_001356dd:
                        puVar16 = (prVar38->cstate).filtered_buf;
                        uVar34 = uVar34 & 0xffffffff;
                        puVar16[uVar34] = (uint8_t)uVar12;
                        puVar16[uVar34 + 1] = (uint8_t)(uVar12 >> 8);
                        puVar16[uVar34 + 2] = (uint8_t)(uVar12 >> 0x10);
                        puVar16[uVar34 + 3] = (uint8_t)(uVar26 >> 0x18);
                      }
                      uVar34 = uVar40 + 5;
                      pdVar17 = local_270;
                    }
                    a = local_278;
                    uVar40 = uVar34;
                  } while ((long)uVar34 < *(long *)(puVar20 + 6) + -4);
                }
              }
              else if (uVar36 == 3) {
                pdVar17 = (decode_table *)(prVar38->cstate).window_buf;
                uVar40 = (prVar38->cstate).window_mask;
                uVar34 = *(long *)(puVar20 + 4) + (prVar38->cstate).solid_offset;
                uVar35 = uVar34 & uVar40;
                uVar34 = (long)&local_240->header_initialized + uVar34 & uVar40;
                if ((long)uVar34 < (long)uVar35) {
                  local_270 = pdVar17;
                  memcpy(puVar16,(void *)((long)pdVar17->decode_len + (uVar35 - 4)),
                         (uVar40 - uVar35) + 1);
                  memcpy(puVar16 + (uVar40 - uVar35) + 1,local_270,uVar34);
                  prVar39 = local_240;
                }
                else {
                  memcpy(puVar16,(void *)((long)pdVar17->decode_len + (uVar35 - 4)),
                         (size_t)local_240);
                }
                a = local_278;
                if (3 < (long)prVar39) {
                  uVar40 = 0;
                  do {
                    lVar22 = (prVar38->cstate).solid_offset + *(long *)(puVar20 + 4);
                    uVar34 = (prVar38->cstate).window_mask;
                    if ((prVar38->cstate).window_buf[lVar22 + uVar40 + 3 & uVar34] == 0xeb) {
                      uVar12 = read_filter_data(prVar38,(int)lVar22 + (int)uVar40 & (uint)uVar34);
                      uVar35 = uVar40 + *(long *)(puVar20 + 4);
                      uVar34 = uVar40 + 3 + *(long *)(puVar20 + 4);
                      if (-1 < (long)uVar35) {
                        uVar34 = uVar35;
                      }
                      iVar13 = uVar12 - (int)(uVar34 >> 2);
                      puVar16 = (prVar38->cstate).filtered_buf;
                      uVar34 = uVar40 & 0xffffffff;
                      puVar16[uVar34] = (uint8_t)iVar13;
                      puVar16[uVar34 + 1] = (uint8_t)((uint)iVar13 >> 8);
                      puVar16[uVar34 + 2] = (uint8_t)((uint)iVar13 >> 0x10);
                      puVar16[uVar34 + 3] = 0xeb;
                    }
                    uVar40 = uVar40 + 4;
                  } while ((long)uVar40 < *(long *)(puVar20 + 6) + -3);
                }
              }
              else {
                if (uVar36 != 0) {
                  archive_set_error(&a->archive,0x54,"Unsupported filter type: 0x%x");
                  goto LAB_00135733;
                }
                if (0 < (int)puVar20[1]) {
                  lVar22 = 0;
                  lVar15 = 0;
                  do {
                    if (lVar22 < *(long *)(puVar20 + 6)) {
                      uVar29 = '\0';
                      lVar33 = lVar22;
                      do {
                        uVar29 = uVar29 - (prVar38->cstate).window_buf
                                          [(prVar38->cstate).solid_offset + *(long *)(puVar20 + 4) +
                                           lVar15 & (prVar38->cstate).window_mask];
                        (prVar38->cstate).filtered_buf[lVar33] = uVar29;
                        lVar15 = lVar15 + 1;
                        lVar33 = lVar33 + (int)puVar20[1];
                      } while (lVar33 < *(long *)(puVar20 + 6));
                    }
                    lVar22 = lVar22 + 1;
                  } while (lVar22 < (int)puVar20[1]);
                }
              }
              wVar14 = push_data_ready(a,prVar38,(prVar38->cstate).filtered_buf,
                                       *(size_t *)(puVar20 + 6),(prVar38->cstate).last_write_ptr);
              bVar43 = wVar14 == L'\0';
              if (bVar43) {
                piVar3 = &(prVar38->cstate).last_write_ptr;
                *piVar3 = *piVar3 + *(long *)(puVar20 + 6);
                iVar13 = 0;
              }
              else {
                archive_set_error(&a->archive,0x16,"Stack overflow when submitting unpacked data");
                iVar13 = -0x1e;
              }
            }
            prVar39 = local_260;
            a = local_278;
            if (bVar43) {
              uVar8 = (prVar42->cstate).filters.size;
              if (uVar8 != 0) {
                uVar25 = (prVar42->cstate).filters.beg_pos;
                puVar20 = (uint *)(prVar42->cstate).filters.arr[uVar25];
                (prVar42->cstate).filters.beg_pos = uVar25 + 1 & (prVar42->cstate).filters.cap_mask;
                (prVar42->cstate).filters.size = uVar8 - 1;
              }
              free(puVar20);
              goto LAB_0013587f;
            }
          }
          else {
            push_window_data(a,prVar42,lVar22,lVar15);
LAB_0013587f:
            iVar13 = -10;
          }
        }
        wVar14 = L'\0';
        if (iVar13 != -10) {
          if (iVar13 == -0x1e) goto LAB_0013431a;
          if ((prVar39->cstate).filters.size == 0) {
            lVar22 = (prVar39->cstate).write_ptr;
          }
          else {
            lVar15 = *(long *)((prVar39->cstate).filters.arr[(prVar39->cstate).filters.beg_pos] +
                              0x10);
            lVar22 = (prVar39->cstate).write_ptr;
            if (lVar15 < lVar22) {
              lVar22 = lVar15;
            }
          }
          lVar15 = (prVar39->cstate).last_write_ptr;
          if (lVar22 == lVar15) {
            wVar14 = L'\xfffffff6';
          }
          else {
            push_window_data(a,prVar39,lVar15,lVar22);
            (prVar39->cstate).last_write_ptr = lVar22;
          }
        }
      }
      else {
        do {
          local_260 = prVar42;
          prVar42 = (rar5 *)a->format->data;
          if (((((ulong)prVar42->main & 2) == 0) || ((prVar42->file).bytes_remaining != 0)) ||
             (wVar14 = advance_multivolume(a), wVar14 == L'\0')) {
            local_268 = prVar42;
            if ((undefined1  [19312])
                ((undefined1  [19312])prVar42->cstate & (undefined1  [19312])0x8) ==
                (undefined1  [19312])0x0) {
              pdVar17 = (decode_table *)(prVar42->cstate).block_buf;
            }
            else {
              local_1e8[0] = 0xffffffffffffffff;
              pdVar17 = (decode_table *)__archive_read_ahead(a,6,(ssize_t *)local_1e8);
              uVar40 = 1;
              wVar14 = L'\x01';
              if (pdVar17 == (decode_table *)0x0) {
LAB_00134c00:
                bVar43 = false;
              }
              else {
                cVar4 = *(compressed_block_header *)&pdVar17->size;
                prVar42->last_block_hdr = cVar4;
                uVar25 = (ushort)cVar4 >> 3 & 7;
                bVar23 = (byte)uVar25;
                if (bVar23 < 3) {
                  wVar14 = L'\xffffffe2';
                  if (bVar23 == 2) {
                    local_230 = (ulong)((uint)*(byte *)((long)&pdVar17->size + 3) << 8 |
                                       (uint)(byte)pdVar17->decode_len[0] << 0x10) |
                                (ulong)*(byte *)((long)&pdVar17->size + 2);
                  }
                  else if (uVar25 == 1) {
                    local_230 = (ulong)*(ushort *)((long)&pdVar17->size + 2);
                  }
                  else {
                    if (((ushort)cVar4 >> 3 & 7) != 0) {
                      local_230 = 0;
                      bVar43 = false;
                      goto LAB_00134488;
                    }
                    local_230 = (ulong)*(byte *)((long)&pdVar17->size + 2);
                  }
                  if ((((uint)(local_230 >> 0x10) ^ (uint)local_230 ^
                        (uint)(local_230 >> 8) ^ (uint)cVar4.block_flags_u8 ^ 0x5a) & 0xff) ==
                      (uint)(local_268->last_block_hdr).block_cksum) {
                    wVar14 = L'\0';
                    bVar43 = true;
                  }
                  else {
                    bVar43 = false;
                    archive_set_error(&local_278->archive,0x54,
                                      "Block checksum error: got 0x%x, expected 0x%x");
                  }
                }
                else {
                  bVar43 = false;
                  archive_set_error(&a->archive,0x54,
                                    "Unsupported block header size (was %d, max is 2)");
                  wVar14 = L'\xffffffe2';
                }
LAB_00134488:
                prVar42 = local_268;
                a = local_278;
                if (bVar43) {
                  lVar22 = (ulong)((local_268->last_block_hdr).block_flags_u8 >> 3 & 7) + 3;
                  local_270 = pdVar17;
                  iVar21 = __archive_read_consume(local_278,lVar22);
                  wVar14 = L'\x01';
                  if (iVar21 == lVar22) {
                    lVar22 = (prVar42->file).bytes_remaining - lVar22;
                    (prVar42->file).bytes_remaining = lVar22;
                    if (lVar22 < (long)local_230) {
                      pdVar17 = (decode_table *)a->format->data;
                      if (pdVar17->decode_len[2] == 0) {
                        *(byte *)(pdVar17->decode_len + 0xd) = (byte)pdVar17->decode_len[0xd] | 4;
                        local_238 = pdVar17;
                        if (*(void **)(pdVar17[5].quick_num + 0x202) != (void *)0x0) {
                          free(*(void **)(pdVar17[5].quick_num + 0x202));
                        }
                        uVar40 = local_230;
                        pvVar18 = malloc(local_230 + 8);
                        pdVar17 = local_270;
                        *(void **)(local_238[5].quick_num + 0x202) = pvVar18;
                        if (pvVar18 == (void *)0x0) {
                          archive_set_error(&a->archive,0xc,
                                            "Can\'t allocate memory for a merge block buffer.");
                          uVar40 = 0xffffffe2;
                          prVar42 = local_268;
                        }
                        else {
                          *(undefined8 *)((long)pvVar18 + uVar40) = 0;
                          uVar34 = *(ulong *)(local_238[5].quick_len + 0x84);
                          if ((long)uVar40 <= (long)*(ulong *)(local_238[5].quick_len + 0x84)) {
                            uVar34 = uVar40;
                          }
                          if (uVar34 != 0) {
                            prVar38 = (rar5 *)0x0;
                            do {
                              local_1e8[0] = 0xffffffffffffffff;
                              pvVar18 = __archive_read_ahead(a,uVar34,(ssize_t *)local_1e8);
                              pdVar32 = local_238;
                              prVar42 = local_268;
                              paVar9 = local_278;
                              uVar40 = 1;
                              prVar39 = local_260;
                              if (pvVar18 == (void *)0x0) goto LAB_00134766;
                              prVar39 = (rar5 *)((long)&prVar38->header_initialized + uVar34);
                              if ((long)local_230 < (long)prVar39) {
                                archive_set_error(&local_278->archive,0x16,
                                                  "Consumed too much data when merging blocks.");
                                uVar40 = 0xffffffe2;
                                a = paVar9;
                                prVar39 = local_260;
                                goto LAB_00134766;
                              }
                              local_240 = prVar39;
                              memcpy((void *)((long)&prVar38->header_initialized +
                                             *(long *)(local_238[5].quick_num + 0x202)),pvVar18,
                                     uVar34);
                              sVar19 = __archive_read_consume(local_278,uVar34);
                              prVar39 = local_260;
                              a = local_278;
                              if (sVar19 != uVar34) goto LAB_00134766;
                              sVar19 = *(size_t *)(pdVar32[5].quick_len + 0x84);
                              *(size_t *)(pdVar32[5].quick_len + 0x84) = sVar19 - uVar34;
                              sVar41 = local_230 - (long)local_240;
                              if (sVar41 == 0) {
                                pdVar17 = *(decode_table **)(pdVar32[5].quick_num + 0x202);
                                uVar40 = 0;
                                prVar42 = local_268;
                                goto LAB_00134766;
                              }
                              if (sVar19 == uVar34) {
                                pdVar32->decode_len[2] = pdVar32->decode_len[2] + 1;
                                wVar14 = advance_multivolume(local_278);
                                local_238->decode_len[2] = local_238->decode_len[2] + -1;
                                pdVar32 = local_238;
                                if (wVar14 != L'\0') {
                                  uVar40 = (ulong)(uint)wVar14;
                                  a = local_278;
                                  prVar42 = local_268;
                                  goto LAB_00134766;
                                }
                              }
                              uVar34 = sVar41;
                              if ((long)*(size_t *)(pdVar32[5].quick_len + 0x84) < (long)sVar41) {
                                uVar34 = *(size_t *)(pdVar32[5].quick_len + 0x84);
                              }
                              a = local_278;
                              prVar38 = local_240;
                            } while (uVar34 != 0);
                          }
                          archive_set_error(&a->archive,0x54,
                                            "Encountered block size == 0 during block merge");
                          uVar40 = 0xffffffe2;
                          prVar39 = local_260;
                          prVar42 = local_268;
                        }
                      }
                      else {
                        archive_set_error(&a->archive,0x16,"Recursive merge is not allowed");
                        uVar40 = 0xffffffe2;
                        pdVar17 = local_270;
                      }
LAB_00134766:
                      wVar14 = (wchar_t)uVar40;
                      if (wVar14 != L'\0') goto LAB_00134c00;
                    }
                    else {
                      *(byte *)&prVar42->cstate = *(byte *)&prVar42->cstate & 0xfb;
                      local_1e8[0] = 0xffffffffffffffff;
                      pdVar17 = (decode_table *)
                                __archive_read_ahead(a,local_230 + 4,(ssize_t *)local_1e8);
                      if (pdVar17 == (decode_table *)0x0) {
                        bVar43 = false;
                        goto LAB_00134c02;
                      }
                    }
                    wVar14 = (wchar_t)uVar40;
                    (prVar42->cstate).block_buf = (uint8_t *)pdVar17;
                    (prVar42->cstate).cur_block_size = local_230;
                    *(byte *)&prVar42->cstate = *(byte *)&prVar42->cstate & 0xf7;
                    (prVar42->bits).in_addr = L'\0';
                    (prVar42->bits).bit_addr = '\0';
                    if ((char)(prVar42->last_block_hdr).block_flags_u8 < '\0') {
                      iVar13 = 0;
                      wVar14 = L'\0';
                      uVar40 = CONCAT71((int7)(uVar40 >> 8),4);
                      uVar36 = 0xf0;
                      do {
                        if ((long)local_230 <= (long)wVar14) {
                          archive_set_error(&a->archive,0x54,"Truncated data in huffman tables");
                          wVar14 = L'\xffffffe2';
                          prVar39 = local_260;
                          goto LAB_00134bf3;
                        }
                        uVar10 = (*(byte *)((long)pdVar17->decode_len + (long)wVar14 + -4) & uVar36)
                                 >> (sbyte)uVar40;
                        wVar14 = wVar14 + (uint)(uVar36 == 0xf);
                        uVar31 = uVar36 ^ 0xff;
                        uVar34 = uVar40 ^ 4;
                        if (uVar10 == 0xf) {
                          uVar10 = uVar31 & *(byte *)((long)pdVar17->decode_len + (long)wVar14 + -4)
                          ;
                          sVar24 = (sbyte)uVar34;
                          wVar14 = wVar14 + (uint)(uVar36 == 0xf0);
                          uVar34 = uVar40;
                          uVar31 = uVar36;
                          if (uVar10 >> sVar24 == 0) {
                            lVar22 = (long)iVar13;
                            iVar13 = iVar13 + 1;
                            *(undefined1 *)((long)local_218 + lVar22) = 0xf;
                          }
                          else if (iVar13 < 0x14) {
                            local_270 = (decode_table *)(long)iVar13;
                            uVar10 = (uVar10 >> sVar24) + 1;
                            uVar36 = 0x13U - iVar13;
                            if (uVar10 < 0x13U - iVar13) {
                              uVar36 = uVar10;
                            }
                            memset((uint8_t *)((long)local_218 + (long)local_270),0,
                                   (ulong)(uVar36 + 1));
                            uVar40 = 0x13U - (long)local_270;
                            if ((ulong)uVar10 <= 0x13U - (long)local_270) {
                              uVar40 = (ulong)uVar10;
                            }
                            iVar13 = iVar13 + (int)uVar40 + 1;
                          }
                        }
                        else {
                          lVar22 = (long)iVar13;
                          iVar13 = iVar13 + 1;
                          *(char *)((long)local_218 + lVar22) = (char)uVar10;
                        }
                        a = local_278;
                        uVar40 = uVar34;
                        uVar36 = uVar31;
                      } while (iVar13 < 0x14);
                      (local_268->bits).in_addr = wVar14;
                      uVar34 = uVar34 ^ 4;
                      (local_268->bits).bit_addr = (int8_t)uVar34;
                      pdVar32 = &(local_268->cstate).bd;
                      create_decode_tables((uint8_t *)local_218,pdVar32,L'\x14');
                      uVar36 = 0;
                      prVar39 = local_260;
                      local_270 = pdVar32;
                      do {
                        prVar42 = local_268;
                        if (0x1ad < (int)uVar36) {
                          create_decode_tables((uint8_t *)local_1e8,&(local_268->cstate).ld,L'Ĳ');
                          create_decode_tables(local_b6,&(prVar42->cstate).dd,L'@');
                          create_decode_tables(local_76,&(prVar42->cstate).ldd,L'\x10');
                          create_decode_tables(local_66,&(prVar42->cstate).rd,L',');
                          wVar14 = L'\0';
                          break;
                        }
                        wVar14 = decode_number(a,pdVar32,(uint8_t *)pdVar17,(uint16_t *)&local_224);
                        prVar42 = local_268;
                        if (wVar14 == L'\0') {
                          uVar25 = (ushort)local_224;
                          if ((ushort)local_224 < 0x10) {
                            *(char *)((long)local_1e8 + (long)(int)uVar36) = (char)local_224;
                            uVar36 = uVar36 + 1;
                          }
                          else if ((ushort)local_224 < 0x12) {
                            wVar14 = read_bits_16(local_278,local_268,(uint8_t *)pdVar17,&local_27a)
                            ;
                            if (wVar14 == L'\0') {
                              uVar5 = local_27a >> 9;
                              local_27a = (local_27a >> 0xd) + 3;
                              if (uVar25 != 0x10) {
                                local_27a = uVar5 + 0xb;
                              }
                              iVar13 = (int)(prVar42->bits).bit_addr + (uint)(uVar25 != 0x10) * 4 +
                                       3;
                              pwVar1 = &(prVar42->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar13 >> 3);
                              (prVar42->bits).bit_addr = (byte)iVar13 & 7;
                              if ((int)uVar36 < 1) {
                                archive_set_error(&local_278->archive,0x54,
                                                  "Unexpected error when decoding huffman tables");
                                uVar34 = 0xffffffe2;
                                goto LAB_00134958;
                              }
                              bVar43 = local_27a != 0;
                              local_27a = local_27a - 1;
                              if (bVar43) {
                                uVar40 = (ulong)uVar36;
                                iVar13 = uVar36 - 1;
                                lVar22 = 0;
                                uVar31 = uVar36;
                                do {
                                  *(undefined1 *)((long)local_1e8 + lVar22 + uVar40) =
                                       *(undefined1 *)
                                        ((long)local_1e8 + (ulong)(uint)(iVar13 + (int)lVar22));
                                  uVar25 = (ushort)lVar22;
                                  uVar36 = uVar31 + 1;
                                  lVar22 = lVar22 + 1;
                                  if (local_27a == uVar25) break;
                                  bVar43 = (int)uVar31 < 0x1ad;
                                  uVar31 = uVar36;
                                } while (bVar43);
                                local_27a = local_27a - (short)lVar22;
                              }
                              bVar43 = true;
                            }
                            else {
                              uVar34 = (ulong)(uint)wVar14;
LAB_00134958:
                              bVar43 = false;
                            }
                            pdVar32 = local_270;
                            if (!bVar43) {
                              bVar43 = false;
                              goto LAB_00134922;
                            }
                          }
                          else {
                            wVar14 = read_bits_16(local_278,local_268,(uint8_t *)pdVar17,&local_27a)
                            ;
                            if (wVar14 == L'\0') {
                              uVar8 = (local_27a >> 0xd) + 3;
                              if (uVar25 != 0x12) {
                                uVar8 = (local_27a >> 9) + 0xb;
                              }
                              iVar13 = (int)(prVar42->bits).bit_addr + (uint)(uVar25 != 0x12) * 4 +
                                       3;
                              pwVar1 = &(prVar42->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar13 >> 3);
                              (prVar42->bits).bit_addr = (byte)iVar13 & 7;
                              local_27a = uVar8 - 1;
                              if (uVar8 != 0) {
                                local_238 = (decode_table *)(long)(int)uVar36;
                                uVar31 = 0x1ad;
                                if (0x1ad < (int)uVar36) {
                                  uVar31 = uVar36;
                                }
                                uVar35 = (ulong)local_27a;
                                uVar40 = (ulong)(uVar31 - uVar36);
                                if (uVar35 <= uVar31 - uVar36) {
                                  uVar40 = uVar35;
                                }
                                local_240 = (rar5 *)((ulong)local_240 & 0xffffffff00000000);
                                local_27a = uVar8;
                                memset((void *)((long)local_1e8 + (long)local_238),0,uVar40 + 1);
                                pdVar27 = (decode_table *)0x1ad;
                                if (0x1ad < (long)local_238) {
                                  pdVar27 = local_238;
                                }
                                uVar40 = (long)pdVar27 - (long)local_238;
                                if (uVar35 <= (ulong)((long)pdVar27 - (long)local_238)) {
                                  uVar40 = uVar35;
                                }
                                local_27a = (uVar8 - (short)uVar40) - 2;
                                uVar36 = uVar36 + (int)uVar40 + 1;
                                wVar14 = (wchar_t)local_240;
                              }
                            }
                            else {
                              uVar34 = (ulong)(uint)wVar14;
                            }
                            prVar39 = local_260;
                            if (wVar14 != L'\0') {
                              bVar43 = false;
                              goto LAB_00134922;
                            }
                          }
                          bVar43 = true;
                        }
                        else {
                          bVar43 = false;
                          archive_set_error(&a->archive,0x54,"Decoding huffman tables failed");
                          uVar34 = 0xffffffe2;
                        }
LAB_00134922:
                        wVar14 = (wchar_t)uVar34;
                        a = local_278;
                      } while (bVar43);
LAB_00134bf3:
                      if (wVar14 != L'\0') goto LAB_00134c00;
                    }
                    bVar43 = true;
                  }
                  else {
                    bVar43 = false;
                    pdVar17 = local_270;
                  }
                }
                else {
                  bVar43 = false;
                }
              }
LAB_00134c02:
              if (!bVar43) goto LAB_0013535d;
            }
            prVar39 = (rar5 *)a->format->data;
            if ((prVar39->cstate).write_ptr - (prVar39->cstate).last_write_ptr <=
                (prVar39->cstate).window_size >> 1) {
              local_240 = (rar5 *)(prVar39->cstate).window_mask;
              local_270 = (decode_table *)
                          (CONCAT71(local_270._1_7_,(prVar39->last_block_hdr).block_flags_u8) &
                          0xffffffffffffff07);
              local_1f0 = &(prVar39->cstate).rd;
              local_238 = &(prVar39->cstate).dd;
              local_1f8 = &(prVar39->cstate).ldd;
LAB_00134c73:
              do {
                lVar15 = (long)(prVar39->bits).in_addr;
                lVar22 = (prVar39->cstate).cur_block_size;
                if ((lVar22 <= lVar15) ||
                   ((lVar22 + -1 == lVar15 && ((char)local_270 < (prVar39->bits).bit_addr)))) {
                  *(byte *)&prVar39->cstate = *(byte *)&prVar39->cstate | 8;
                  break;
                }
                wVar14 = decode_number(a,&(prVar39->cstate).ld,(uint8_t *)pdVar17,&local_27c);
                if (wVar14 != L'\0') {
                  wVar14 = L'\x01';
                  goto LAB_00135354;
                }
                if (local_27c < 0x100) {
                  lVar22 = (prVar39->cstate).write_ptr;
                  (prVar39->cstate).write_ptr = lVar22 + 1;
                  (prVar39->cstate).window_buf
                  [lVar22 + (prVar39->cstate).solid_offset & (ulong)local_240] = (uint8_t)local_27c;
                }
                else {
                  uVar36 = (uint)local_27c;
                  if (0x105 < uVar36) {
                    wVar14 = decode_code_length(a,prVar39,(uint8_t *)pdVar17,local_27c - 0x106);
                    if (wVar14 == L'\xffffffff') {
                      pcVar30 = "Failed to decode the code length";
                    }
                    else {
                      puVar20 = (uint *)(ulong)(uint)wVar14;
                      wVar14 = decode_number(a,local_238,(uint8_t *)pdVar17,(uint16_t *)local_218);
                      if (wVar14 == L'\0') {
                        uVar36 = local_218[0] & 0xffff;
                        wVar11 = L'\0';
                        if (3 < (ushort)local_218[0]) {
                          wVar11 = (uint)((ushort)local_218[0] >> 1) + L'\xffffffff';
                          uVar36 = (local_218[0] & 1 | 2) << ((byte)wVar11 & 0x1f);
                        }
                        wVar37 = uVar36 + L'\x01';
                        local_250 = puVar20;
                        wVar14 = local_244;
                        if (L'\0' < wVar11) {
                          if (wVar11 < L'\x04') {
                            local_258 = CONCAT44(local_258._4_4_,wVar37);
                            wVar11 = read_consume_bits(a,prVar39,(uint8_t *)pdVar17,wVar11,
                                                       (wchar_t *)local_1e8);
                            bVar43 = false;
                            wVar37 = L'\0';
                            if (wVar11 == L'\0') {
                              wVar37 = (wchar_t)local_1e8[0];
                            }
                            wVar14 = local_244;
                            if (wVar11 != L'\0') {
                              wVar14 = wVar11;
                            }
                            a = local_278;
                            if (wVar11 != L'\0') goto joined_r0x00134faf;
                            wVar37 = (wchar_t)local_258 + wVar37;
                          }
                          else {
                            if (wVar11 == L'\x04') {
                              local_258 = CONCAT44(local_258._4_4_,wVar37);
LAB_00135219:
                              wVar14 = decode_number(a,local_1f8,(uint8_t *)pdVar17,
                                                     (uint16_t *)local_1e8);
                              if (wVar14 == L'\0') {
                                if ((wchar_t)local_258 <
                                    (int)(0x7ffffffe - (uint)(uint16_t)local_1e8[0])) {
                                  bVar43 = true;
                                  wVar37 = (wchar_t)local_258 + (uint)(uint16_t)local_1e8[0];
                                  wVar14 = local_244;
                                }
                                else {
                                  bVar43 = false;
                                  archive_set_error(&local_278->archive,0x54,
                                                    "Distance pointer overflow");
                                  wVar14 = L'\xffffffe2';
                                  wVar37 = (wchar_t)local_258;
                                }
                              }
                              else {
                                bVar43 = false;
                                archive_set_error(&a->archive,0x16,
                                                  "Failed to decode the distance slot");
                                wVar37 = (wchar_t)local_258;
                                wVar14 = L'\xffffffe2';
                              }
                            }
                            else {
                              uVar34 = (ulong)(prVar39->bits).in_addr;
                              uVar40 = (prVar39->cstate).cur_block_size;
                              if ((long)uVar34 < (long)uVar40) {
                                uVar36 = *(uint *)((long)pdVar17->decode_len + (uVar34 - 4));
                                bVar23 = (prVar39->bits).bit_addr;
                                uVar36 = (uint)(*(byte *)((long)pdVar17->decode_len + uVar34) >>
                                               (8 - bVar23 & 0x1f)) |
                                         (uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 |
                                          (uVar36 & 0xff00) << 8 | uVar36 << 0x18) <<
                                         (bVar23 & 0x1f);
                                wVar14 = L'\0';
                              }
                              else {
                                uVar36 = 0;
                                local_258 = uVar34;
                                local_220 = uVar40;
                                archive_set_error(&local_278->archive,0x16,
                                                  "Premature end of stream during extraction of data (#1)"
                                                 );
                                wVar14 = L'\xffffffe2';
                                uVar34 = local_258;
                                uVar40 = local_220;
                              }
                              if ((long)uVar34 < (long)uVar40) {
                                iVar13 = (prVar39->bits).bit_addr + wVar11 + -4;
                                pwVar1 = &(prVar39->bits).in_addr;
                                *pwVar1 = *pwVar1 + (iVar13 >> 3);
                                (prVar39->bits).bit_addr = (byte)iVar13 & 7;
                                local_258 = CONCAT44(local_258._4_4_,
                                                     wVar37 + (uVar36 >>
                                                              (0x24U - (char)wVar11 & 0x1f)) * 0x10)
                                ;
                                a = local_278;
                                goto LAB_00135219;
                              }
                              bVar43 = false;
                            }
                            a = local_278;
                            if (!bVar43) {
                              bVar43 = false;
                              goto joined_r0x00134faf;
                            }
                          }
                        }
                        if (L'Ā' < wVar37) {
                          if (wVar37 < L'\x2001') {
                            local_250 = (uint *)(ulong)((int)local_250 + 1);
                          }
                          else {
                            local_250 = (uint *)(ulong)((int)local_250 +
                                                        (uint)(L'\x00040000' < wVar37) + 2);
                          }
                        }
                        (prVar39->cstate).dist_cache[3] = (prVar39->cstate).dist_cache[2];
                        *(undefined8 *)((prVar39->cstate).dist_cache + 1) =
                             *(undefined8 *)(prVar39->cstate).dist_cache;
                        (prVar39->cstate).dist_cache[0] = wVar37;
                        (prVar39->cstate).last_len = (wchar_t)local_250;
                        wVar11 = copy_string(a,(wchar_t)local_250,wVar37);
                        bVar43 = wVar11 == L'\0';
                        a = local_278;
                        if (!bVar43) {
                          wVar14 = L'\xffffffe2';
                        }
                        goto joined_r0x00134faf;
                      }
                      pcVar30 = "Failed to decode the distance slot";
                    }
                    bVar43 = false;
                    archive_set_error(&a->archive,0x16,pcVar30);
                    a = local_278;
                    wVar14 = L'\xffffffe2';
joined_r0x00134faf:
                    if (!bVar43) goto LAB_00135354;
                    local_244 = wVar14;
                    if ((prVar39->cstate).window_size >> 1 <
                        (prVar39->cstate).write_ptr - (prVar39->cstate).last_write_ptr) break;
                    goto LAB_00134c73;
                  }
                  if (local_27c == 0x101) {
                    wVar14 = (prVar39->cstate).last_len;
                    if ((wVar14 == L'\0') ||
                       (wVar14 = copy_string(a,wVar14,(prVar39->cstate).dist_cache[0]),
                       wVar14 == L'\0')) goto LAB_00134d93;
                    wVar14 = L'\xffffffe2';
                    goto LAB_00135354;
                  }
                  if (uVar36 != 0x100) {
                    wVar14 = (prVar39->cstate).dist_cache[uVar36 - 0x102];
                    uVar40 = (ulong)(uVar36 - 0x102);
                    if (0x102 < local_27c) {
                      do {
                        (prVar39->cstate).dist_cache[uVar40] =
                             (prVar39->cstate).dist_cache[uVar40 - 1];
                        bVar43 = 1 < (long)uVar40;
                        uVar40 = uVar40 - 1;
                      } while (bVar43);
                    }
                    (prVar39->cstate).dist_cache[0] = wVar14;
                    wVar11 = decode_number(a,local_1f0,(uint8_t *)pdVar17,(uint16_t *)local_1e8);
                    if (wVar11 == L'\0') {
                      wVar11 = decode_code_length(a,prVar39,(uint8_t *)pdVar17,
                                                  (uint16_t)local_1e8[0]);
                      if (wVar11 != L'\xffffffff') {
                        (prVar39->cstate).last_len = wVar11;
                        wVar14 = copy_string(a,wVar11,wVar14);
                        bVar43 = wVar14 == L'\0';
                        wVar14 = local_244;
                        if (!bVar43) {
                          wVar14 = L'\xffffffe2';
                        }
                        goto joined_r0x00134faf;
                      }
                    }
                    bVar43 = false;
                    wVar14 = L'\xffffffe2';
                    goto joined_r0x00134faf;
                  }
                  prVar42 = (rar5 *)a->format->data;
                  wVar14 = parse_filter_data(a,prVar42,(uint8_t *)pdVar17,(uint32_t *)local_1e8);
                  if (((wVar14 == L'\0') &&
                      (wVar14 = parse_filter_data(a,prVar42,(uint8_t *)pdVar17,local_218),
                      wVar14 == L'\0')) &&
                     (wVar14 = read_bits_16(a,prVar42,(uint8_t *)pdVar17,&local_27a),
                     wVar14 == L'\0')) {
                    uVar25 = local_27a >> 0xd;
                    iVar13 = (prVar42->bits).bit_addr + 3;
                    pwVar1 = &(prVar42->bits).in_addr;
                    *pwVar1 = *pwVar1 + (iVar13 >> 3);
                    (prVar42->bits).bit_addr = (byte)iVar13 & 7;
                    if ((short)local_27a < 0 || local_218[0] - 0x400001 < 0xffc00003) {
LAB_00134e58:
                      iVar13 = 0x54;
                      pcVar30 = "Invalid filter encountered";
                      local_27a = uVar25;
                    }
                    else {
                      lVar22 = (prVar42->cstate).last_block_start;
                      lVar15 = (prVar42->cstate).last_block_length;
                      if ((lVar15 != 0 && lVar22 != 0) &&
                         ((long)((prVar42->cstate).write_ptr + (local_1e8[0] & 0xffffffff)) <
                          lVar15 + lVar22)) goto LAB_00134e58;
                      local_250 = (uint *)CONCAT44(local_250._4_4_,(uint)local_27a);
                      local_27a = uVar25;
                      local_258 = (ulong)local_218[0];
                      local_220 = local_1e8[0] & 0xffffffff;
                      puVar20 = (uint *)calloc(1,0x28);
                      if (puVar20 == (uint *)0x0) {
                        puVar20 = (uint *)0x0;
                      }
                      else {
                        uVar5 = (prVar42->cstate).filters.size;
                        uVar6 = (prVar42->cstate).filters.cap_mask;
                        if (uVar6 + 1 != (uint)uVar5) {
                          uVar7 = (prVar42->cstate).filters.end_pos;
                          (prVar42->cstate).filters.arr[uVar7] = (size_t)puVar20;
                          (prVar42->cstate).filters.end_pos = uVar6 & uVar7 + 1;
                          (prVar42->cstate).filters.size = uVar5 + 1;
                        }
                      }
                      if (puVar20 != (uint *)0x0) {
                        *puVar20 = (uint)uVar25;
                        lVar22 = local_220 + (prVar42->cstate).write_ptr;
                        *(long *)(puVar20 + 4) = lVar22;
                        *(ulong *)(puVar20 + 6) = local_258;
                        (prVar42->cstate).last_block_start = lVar22;
                        (prVar42->cstate).last_block_length = local_258;
                        wVar14 = L'\0';
                        if (((uint)local_250 < 0x2000) &&
                           (local_250 = puVar20,
                           wVar14 = read_consume_bits(a,prVar42,(uint8_t *)pdVar17,L'\x05',
                                                      &local_224), wVar14 == L'\0')) {
                          local_250[1] = local_224 + L'\x01';
                          wVar14 = L'\0';
                        }
                        goto LAB_00134d63;
                      }
                      iVar13 = 0xc;
                      pcVar30 = "Can\'t allocate memory for a filter descriptor.";
                    }
                    archive_set_error(&a->archive,iVar13,pcVar30);
                    wVar14 = L'\xffffffe2';
                  }
LAB_00134d63:
                  if (wVar14 != L'\0') goto LAB_00135354;
                }
LAB_00134d93:
              } while ((prVar39->cstate).write_ptr - (prVar39->cstate).last_write_ptr <=
                       (prVar39->cstate).window_size >> 1);
            }
            wVar14 = L'\0';
LAB_00135354:
            prVar39 = local_260;
            prVar42 = local_268;
            if (wVar14 == L'\0') {
              bVar23 = *(byte *)&local_268->cstate;
              if (((bVar23 & 0xc) == 8) && (lVar22 = (local_268->cstate).cur_block_size, 0 < lVar22)
                 ) {
                iVar21 = __archive_read_consume(a,lVar22);
                wVar14 = L'\xffffffe2';
                if (iVar21 == lVar22) {
                  pfVar2 = &prVar42->file;
                  pfVar2->bytes_remaining =
                       pfVar2->bytes_remaining - (prVar42->cstate).cur_block_size;
                  wVar14 = L'\0';
                }
              }
              else {
                wVar14 = L'\0';
                if ((bVar23 & 4) != 0) {
                  *(byte *)&local_268->cstate = bVar23 & 0xfb;
                }
              }
            }
          }
LAB_0013535d:
          if ((wVar14 == L'\xffffffe2') || (wVar14 == L'\x01')) goto LAB_0013431f;
          if ((prVar39->cstate).last_write_ptr != (prVar39->cstate).write_ptr) goto LAB_0013425d;
          prVar42 = local_260;
        } while (((prVar39->last_block_hdr).block_flags_u8 & 0x40) == 0);
        wVar14 = L'\x01';
      }
    }
LAB_0013431f:
    if (wVar14 != L'\xfffffff6') {
      return wVar14;
    }
  } while( true );
}

Assistant:

static int uncompress_file(struct archive_read* a) {
	int ret;

	while(1) {
		/* Sometimes the uncompression function will return a
		 * 'retry' signal. If this will happen, we have to retry
		 * the function. */
		ret = do_uncompress_file(a);
		if(ret != ARCHIVE_RETRY)
			return ret;
	}
}